

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndDragDropSource(void)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if ((GImGui->DragDropSourceFlags & 1) == 0) {
    End();
  }
  if ((pIVar1->DragDropPayload).DataFrameCount == -1) {
    ClearDragDrop();
  }
  pIVar1->DragDropWithinSourceOrTarget = false;
  return;
}

Assistant:

void ImGui::EndDragDropSource()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.DragDropActive);
    IM_ASSERT(g.DragDropWithinSourceOrTarget && "Not after a BeginDragDropSource()?");

    if (!(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        EndTooltip();

    // Discard the drag if have not called SetDragDropPayload()
    if (g.DragDropPayload.DataFrameCount == -1)
        ClearDragDrop();
    g.DragDropWithinSourceOrTarget = false;
}